

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O3

void solver_rebuild_order(solver_t *s)

{
  uint uVar1;
  heap_t *phVar2;
  vec_uint_t *pvVar3;
  vec_int_t *pvVar4;
  sdbl_t *psVar5;
  bool bVar6;
  void *__ptr;
  uint *puVar7;
  char *__function;
  ulong uVar8;
  char *__file;
  char *__assertion;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  vec_char_t *pvVar14;
  uint uVar15;
  
  pvVar14 = s->assigns;
  uVar12 = pvVar14->size;
  uVar13 = 0x10;
  if (0xe < uVar12 - 1) {
    uVar13 = (ulong)uVar12;
  }
  uVar15 = 0;
  if ((int)uVar13 == 0) {
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc(uVar13 << 2);
  }
  if (uVar12 != 0) {
    uVar15 = 0;
    uVar8 = 0;
    do {
      if (pvVar14->data[uVar8] == '\x03') {
        uVar12 = (uint)uVar13;
        if (uVar15 == uVar12) {
          if (uVar12 < 0x10) {
            __ptr = realloc(__ptr,0x40);
            if (__ptr == (void *)0x0) goto LAB_0055df58;
            uVar13 = 0x10;
          }
          else {
            if ((int)uVar12 < 1) goto LAB_0055dc76;
            uVar13 = (ulong)(uVar12 * 2);
            __ptr = realloc(__ptr,uVar13 * 4);
            if (__ptr == (void *)0x0) goto LAB_0055df58;
          }
          pvVar14 = s->assigns;
        }
LAB_0055dc76:
        *(int *)((long)__ptr + (ulong)uVar15 * 4) = (int)uVar8;
        uVar15 = uVar15 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < pvVar14->size);
  }
  phVar2 = s->var_order;
  pvVar3 = phVar2->data;
  if (pvVar3->size != 0) {
    puVar7 = pvVar3->data;
    pvVar4 = phVar2->indices;
    uVar13 = 0;
    do {
      if (pvVar4->size <= puVar7[uVar13]) goto LAB_0055df1a;
      pvVar4->data[puVar7[uVar13]] = -1;
      uVar13 = uVar13 + 1;
    } while (uVar13 < pvVar3->size);
  }
  pvVar3->size = 0;
  if (uVar15 != 0) {
    uVar13 = 0;
    do {
      uVar12 = *(uint *)((long)__ptr + uVar13 * 4);
      if (phVar2->indices->size <= uVar12) goto LAB_0055df1a;
      phVar2->indices->data[uVar12] = (int)uVar13;
      pvVar3 = phVar2->data;
      uVar11 = pvVar3->size;
      uVar8 = (ulong)uVar11;
      if (uVar11 == pvVar3->cap) {
        if (uVar11 < 0x10) {
          puVar7 = (uint *)realloc(pvVar3->data,0x40);
          pvVar3->data = puVar7;
          uVar11 = 0x10;
          if (puVar7 == (uint *)0x0) goto LAB_0055df58;
        }
        else {
          if ((int)uVar11 < 1) goto LAB_0055dd63;
          puVar7 = (uint *)realloc(pvVar3->data,uVar8 * 8);
          pvVar3->data = puVar7;
          if (puVar7 == (uint *)0x0) {
LAB_0055df58:
            __assert_fail("p->data != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                          ,0x6e,"void vec_uint_reserve(vec_uint_t *, unsigned int)");
          }
          uVar11 = uVar11 * 2;
        }
        pvVar3->cap = uVar11;
        uVar8 = (ulong)pvVar3->size;
      }
LAB_0055dd63:
      pvVar3->data[uVar8] = uVar12;
      pvVar3->size = pvVar3->size + 1;
      uVar13 = uVar13 + 1;
    } while (uVar15 != uVar13);
    pvVar3 = phVar2->data;
    if (pvVar3->size < 2) goto LAB_0055dec2;
    uVar13 = (ulong)(pvVar3->size >> 1);
    do {
      uVar8 = uVar13 - 1;
      uVar12 = pvVar3->size;
      uVar15 = (uint)uVar8;
      if (uVar12 <= uVar15) {
LAB_0055defb:
        __assertion = "idx >= 0 && idx < p->size";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
        ;
        __function = "unsigned int vec_uint_at(vec_uint_t *, unsigned int)";
LAB_0055df10:
        __assert_fail(__assertion,__file,0x85,__function);
      }
      puVar7 = pvVar3->data;
      uVar1 = puVar7[uVar8];
      uVar11 = uVar15 * 2 + 1;
      uVar9 = uVar15;
      if (uVar11 < uVar12) {
        uVar10 = uVar8 & 0xffffffff;
        do {
          uVar15 = uVar15 * 2 + 2;
          if (uVar15 < uVar12) {
            uVar9 = phVar2->weights->size;
            if ((puVar7[uVar15] < uVar9) && (puVar7[uVar11] < uVar9)) {
              psVar5 = phVar2->weights->data;
              if (psVar5[puVar7[uVar15]] <= psVar5[puVar7[uVar11]]) goto LAB_0055ddfe;
              goto LAB_0055de01;
            }
LAB_0055dee4:
            __assertion = "i >= 0 && i < p->size";
            __file = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_sdbl.h"
            ;
            __function = "sdbl_t vec_sdbl_at(vec_sdbl_t *, unsigned int)";
            goto LAB_0055df10;
          }
LAB_0055ddfe:
          uVar15 = uVar11;
LAB_0055de01:
          if (uVar12 <= uVar15) goto LAB_0055defb;
          uVar11 = puVar7[uVar15];
          uVar9 = phVar2->weights->size;
          if ((uVar9 <= uVar11) || (uVar9 <= uVar1)) goto LAB_0055dee4;
          psVar5 = phVar2->weights->data;
          uVar9 = (uint)uVar10;
          if (psVar5[uVar11] <= psVar5[uVar1]) break;
          if (uVar12 <= uVar9) goto LAB_0055df39;
          puVar7[uVar10] = uVar11;
          if (pvVar3->size <= uVar9) goto LAB_0055defb;
          if (phVar2->indices->size <= uVar11) goto LAB_0055df1a;
          phVar2->indices->data[uVar11] = uVar9;
          uVar11 = uVar15 * 2 + 1;
          uVar12 = pvVar3->size;
          uVar10 = (ulong)uVar15;
          uVar9 = uVar15;
        } while (uVar11 < uVar12);
      }
      if (uVar12 <= uVar9) {
LAB_0055df39:
        __assert_fail("(idx >= 0) && (idx < vec_uint_size(p))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                      ,0xc2,"void vec_uint_assign(vec_uint_t *, unsigned int, unsigned int)");
      }
      puVar7[uVar9] = uVar1;
      if (phVar2->indices->size <= uVar1) {
LAB_0055df1a:
        __assert_fail("(i >= 0) && (i < vec_int_size(p))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_int.h"
                      ,0xa6,"void vec_int_assign(vec_int_t *, unsigned int, int)");
      }
      phVar2->indices->data[uVar1] = uVar9;
      bVar6 = 1 < (long)uVar13;
      uVar13 = uVar8;
    } while (bVar6);
  }
  if (__ptr == (void *)0x0) {
    return;
  }
LAB_0055dec2:
  free(__ptr);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

//===------------------------------------------------------------------------===
// Satoko internal functions
//===------------------------------------------------------------------------===
static inline void solver_rebuild_order(solver_t *s)
{
    unsigned var;
    vec_uint_t *vars = vec_uint_alloc(vec_char_size(s->assigns));

    for (var = 0; var < vec_char_size(s->assigns); var++)
        if (var_value(s, var) == SATOKO_VAR_UNASSING)
            vec_uint_push_back(vars, var);
    heap_build(s->var_order, vars);
    vec_uint_free(vars);
}